

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGValidateCompiledCallback
               (xmlRegExecCtxtPtr exec,xmlChar *token,void *transdata,void *inputdata)

{
  int iVar1;
  xmlRelaxNGValidCtxtPtr ctxt;
  char *msg;
  xmlRelaxNGDefinePtr_conflict define;
  
  if (inputdata == (void *)0x0) {
    xmlRngVErr((xmlRelaxNGValidCtxtPtr)0x0,(xmlNodePtr)0x0,1,"callback on %s missing context\n",
               token,(xmlChar *)0x0);
    return;
  }
  if (transdata == (void *)0x0) {
    if (*token == '#') {
      return;
    }
    msg = "callback on %s missing define\n";
  }
  else {
    if (*transdata == 4) {
      iVar1 = xmlRelaxNGValidateDefinition
                        ((xmlRelaxNGValidCtxtPtr)inputdata,(xmlRelaxNGDefinePtr_conflict)transdata);
      if (iVar1 == 0) {
        return;
      }
      *(int *)((long)inputdata + 0xb8) = iVar1;
      return;
    }
    msg = "callback on %s define is not element\n";
  }
  xmlRngVErr((xmlRelaxNGValidCtxtPtr)inputdata,(xmlNodePtr)0x0,1,msg,token,(xmlChar *)0x0);
  if (*(int *)((long)inputdata + 0x44) == 0) {
    *(undefined4 *)((long)inputdata + 0x44) = 0x25;
  }
  return;
}

Assistant:

static void
xmlRelaxNGValidateCompiledCallback(xmlRegExecCtxtPtr exec ATTRIBUTE_UNUSED,
                                   const xmlChar * token,
                                   void *transdata, void *inputdata)
{
    xmlRelaxNGValidCtxtPtr ctxt = (xmlRelaxNGValidCtxtPtr) inputdata;
    xmlRelaxNGDefinePtr define = (xmlRelaxNGDefinePtr) transdata;
    int ret;

    if (ctxt == NULL) {
        xmlRngVErr(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
                   "callback on %s missing context\n", token, NULL);
        return;
    }
    if (define == NULL) {
        if (token[0] == '#')
            return;
        xmlRngVErr(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
                   "callback on %s missing define\n", token, NULL);
        if ((ctxt != NULL) && (ctxt->errNo == XML_RELAXNG_OK))
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        return;
    }
    if (define->type != XML_RELAXNG_ELEMENT) {
        xmlRngVErr(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
                   "callback on %s define is not element\n", token, NULL);
        if (ctxt->errNo == XML_RELAXNG_OK)
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        return;
    }
    ret = xmlRelaxNGValidateDefinition(ctxt, define);
    if (ret != 0)
        ctxt->perr = ret;
}